

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_construct_destruct_fromCString_valid_fn(int _i)

{
  int iVar1;
  AString *str;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *__s2;
  
  str = AString_constructFromCString("xyz1234567890",3);
  if (str == (AString *)0x0) {
    pcVar2 = (char *)0x0;
    __s2 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) string != NULL";
    pcVar5 = "(void*) string";
    iVar1 = 0x5d;
    goto LAB_0011e6ab;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5d);
  if (str->reallocator == (ACUtilsReallocator)0x0) {
    pcVar2 = (char *)0x0;
    __s2 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) string->reallocator != NULL";
    pcVar5 = "(void*) string->reallocator";
    iVar1 = 0x5e;
    goto LAB_0011e6ab;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5e);
  if (str->deallocator == (ACUtilsDeallocator)0x0) {
    pcVar2 = (char *)0x0;
    __s2 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %#x";
    pcVar4 = "(void*) string->deallocator != NULL";
    pcVar5 = "(void*) string->deallocator";
    iVar1 = 0x5f;
    goto LAB_0011e6ab;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x5f);
  pcVar2 = (char *)str->capacity;
  if (pcVar2 == (char *)0x8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x60);
    if (str->buffer == (char *)0x0) {
      pcVar2 = (char *)0x0;
      __s2 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (*string).buffer != NULL";
      pcVar5 = "(void*) (*string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x60);
      __s2 = str->buffer;
      if (__s2 == (char *)0x0) {
        pcVar2 = "";
        __s2 = "(null)";
      }
      else {
        iVar1 = strcmp("xyz",__s2);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x60);
          pcVar2 = (char *)str->size;
          if (pcVar2 == (char *)0x3) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x60);
            AString_destruct(str);
            return;
          }
          __s2 = "strlen(\"xyz\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar4 = "(*string).size == strlen(\"xyz\")";
          pcVar5 = "(*string).size";
          goto LAB_0011e6a9;
        }
        pcVar2 = "\"";
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(*string).buffer == (\"xyz\")";
      pcVar5 = "(*string).buffer";
    }
  }
  else {
    __s2 = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(*string).capacity == (8)";
    pcVar5 = "(*string).capacity";
  }
LAB_0011e6a9:
  iVar1 = 0x60;
LAB_0011e6ab:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar3,pcVar4,pcVar5,pcVar2,__s2);
}

Assistant:

END_TEST
START_TEST(test_AString_construct_destruct_fromCString_valid)
{
    struct AString *string = AString_constructFromCString("xyz1234567890", 3);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->reallocator);
    ACUTILSTEST_ASSERT_PTR_NONNULL(string->deallocator);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*string, "xyz", 8);
    AString_destruct(string);
}